

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serv.cpp
# Opt level: O0

ICUServiceFactory * __thiscall
icu_63::ICUService::createSimpleFactory
          (ICUService *this,UObject *objToAdopt,UnicodeString *id,UBool visible,UErrorCode *status)

{
  UBool UVar1;
  SimpleFactory *this_00;
  UObject *size;
  SimpleFactory *local_60;
  UErrorCode *status_local;
  UBool visible_local;
  UnicodeString *id_local;
  UObject *objToAdopt_local;
  ICUService *this_local;
  
  size = objToAdopt;
  UVar1 = ::U_SUCCESS(*status);
  if (UVar1 != '\0') {
    if ((objToAdopt != (UObject *)0x0) && (UVar1 = UnicodeString::isBogus(id), UVar1 == '\0')) {
      this_00 = (SimpleFactory *)UMemory::operator_new((UMemory *)0x58,(size_t)size);
      local_60 = (SimpleFactory *)0x0;
      if (this_00 != (SimpleFactory *)0x0) {
        SimpleFactory::SimpleFactory(this_00,objToAdopt,id,visible);
        local_60 = this_00;
      }
      return &local_60->super_ICUServiceFactory;
    }
    *status = U_ILLEGAL_ARGUMENT_ERROR;
  }
  return (ICUServiceFactory *)0x0;
}

Assistant:

ICUServiceFactory* 
ICUService::createSimpleFactory(UObject* objToAdopt, const UnicodeString& id, UBool visible, UErrorCode& status)
{
    if (U_SUCCESS(status)) {
        if ((objToAdopt != NULL) && (!id.isBogus())) {
            return new SimpleFactory(objToAdopt, id, visible);
        }
        status = U_ILLEGAL_ARGUMENT_ERROR;
    }
    return NULL;
}